

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void * stbi__do_png(stbi__png *p,int *x,int *y,int *n,int req_comp,stbi__result_info *ri)

{
  int iVar1;
  undefined4 *in_RCX;
  undefined4 *in_RDX;
  stbi__uint16 *in_RSI;
  long *in_RDI;
  int in_R8D;
  int *in_R9;
  void *result;
  int in_stack_00000420;
  int in_stack_00000424;
  stbi__png *in_stack_00000428;
  stbi__uint16 *local_40;
  uint x_00;
  stbi__uint16 *local_8;
  
  local_40 = (stbi__uint16 *)0x0;
  if ((in_R8D < 0) || (4 < in_R8D)) {
    stbi__err("bad req_comp");
    local_8 = (stbi__uint16 *)0x0;
  }
  else {
    iVar1 = stbi__parse_png_file(in_stack_00000428,in_stack_00000424,in_stack_00000420);
    if (iVar1 != 0) {
      if ((int)in_RDI[4] < 9) {
        *in_R9 = 8;
      }
      else {
        if ((int)in_RDI[4] != 0x10) {
          stbi__err("bad bits_per_channel");
          return (void *)0x0;
        }
        *in_R9 = 0x10;
      }
      local_40 = (stbi__uint16 *)in_RDI[3];
      in_RDI[3] = 0;
      if ((in_R8D != 0) && (in_R8D != *(int *)(*in_RDI + 0xc))) {
        x_00 = (uint)((ulong)in_RCX >> 0x20);
        iVar1 = (int)((ulong)in_RDX >> 0x20);
        if (*in_R9 == 8) {
          local_40 = (stbi__uint16 *)
                     stbi__convert_format((uchar *)in_RSI,iVar1,(int)in_RDX,x_00,(uint)in_RCX);
        }
        else {
          local_40 = stbi__convert_format16(in_RSI,iVar1,(int)in_RDX,x_00,(uint)in_RCX);
        }
        *(int *)(*in_RDI + 0xc) = in_R8D;
        if (local_40 == (stbi__uint16 *)0x0) {
          return (void *)0x0;
        }
      }
      *(undefined4 *)in_RSI = *(undefined4 *)*in_RDI;
      *in_RDX = *(undefined4 *)(*in_RDI + 4);
      if (in_RCX != (undefined4 *)0x0) {
        *in_RCX = *(undefined4 *)(*in_RDI + 8);
      }
    }
    free((void *)in_RDI[3]);
    in_RDI[3] = 0;
    free((void *)in_RDI[2]);
    in_RDI[2] = 0;
    free((void *)in_RDI[1]);
    in_RDI[1] = 0;
    local_8 = local_40;
  }
  return local_8;
}

Assistant:

static void *stbi__do_png(stbi__png *p, int *x, int *y, int *n, int req_comp, stbi__result_info *ri)
{
   void *result=NULL;
   if (req_comp < 0 || req_comp > 4) return stbi__errpuc("bad req_comp", "Internal error");
   if (stbi__parse_png_file(p, STBI__SCAN_load, req_comp)) {
      if (p->depth <= 8)
         ri->bits_per_channel = 8;
      else if (p->depth == 16)
         ri->bits_per_channel = 16;
      else
         return stbi__errpuc("bad bits_per_channel", "PNG not supported: unsupported color depth");
      result = p->out;
      p->out = NULL;
      if (req_comp && req_comp != p->s->img_out_n) {
         if (ri->bits_per_channel == 8)
            result = stbi__convert_format((unsigned char *) result, p->s->img_out_n, req_comp, p->s->img_x, p->s->img_y);
         else
            result = stbi__convert_format16((stbi__uint16 *) result, p->s->img_out_n, req_comp, p->s->img_x, p->s->img_y);
         p->s->img_out_n = req_comp;
         if (result == NULL) return result;
      }
      *x = p->s->img_x;
      *y = p->s->img_y;
      if (n) *n = p->s->img_n;
   }
   STBI_FREE(p->out);      p->out      = NULL;
   STBI_FREE(p->expanded); p->expanded = NULL;
   STBI_FREE(p->idata);    p->idata    = NULL;

   return result;
}